

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

LogSeverity jbcoin::Logs::fromString(string *s)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  LogSeverity LVar4;
  size_type sVar5;
  ulong uVar6;
  pointer pcVar7;
  long lVar8;
  long lVar9;
  is_iequal local_70;
  locale local_68 [8];
  string *local_60;
  size_type local_58;
  locale local_50 [8];
  locale local_48 [8];
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_68);
  std::locale::locale(&local_70.m_Loc,local_68);
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar5 = s->_M_string_length;
  local_60 = s;
  if (sVar5 == 0) {
    bVar2 = false;
    pcVar7 = pcVar1;
  }
  else {
    uVar6 = 4;
    if (sVar5 - 1 < 4) {
      uVar6 = sVar5 - 1;
    }
    lVar8 = 0;
    do {
      bVar2 = boost::algorithm::is_iequal::operator()(&local_70,pcVar1 + lVar8,"trace" + lVar8);
      if (!bVar2) {
        std::locale::~locale(&local_70.m_Loc);
        std::locale::~locale(local_68);
        goto LAB_001bed80;
      }
      lVar8 = lVar8 + 1;
    } while (uVar6 + 1 != lVar8);
    bVar2 = lVar8 == 5;
    pcVar7 = pcVar1 + lVar8;
  }
  std::locale::~locale(&local_70.m_Loc);
  std::locale::~locale(local_68);
  LVar4 = lsTRACE;
  if (!(bool)(pcVar7 == pcVar1 + sVar5 & bVar2)) {
LAB_001bed80:
    std::locale::locale(local_68);
    std::locale::locale(&local_70.m_Loc,local_68);
    pcVar1 = (local_60->_M_dataplus)._M_p;
    sVar5 = local_60->_M_string_length;
    if (sVar5 == 0) {
      lVar8 = 0;
      pcVar7 = pcVar1;
    }
    else {
      uVar6 = 4;
      if (sVar5 - 1 < 4) {
        uVar6 = sVar5 - 1;
      }
      lVar8 = uVar6 + 1;
      lVar9 = 0;
      do {
        bVar2 = boost::algorithm::is_iequal::operator()(&local_70,pcVar1 + lVar9,"debug" + lVar9);
        if (!bVar2) {
          std::locale::~locale(&local_70.m_Loc);
          std::locale::~locale(local_68);
          goto LAB_001bee3f;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
      lVar8 = CONCAT71((int7)((ulong)lVar8 >> 8),lVar9 == 5);
      pcVar7 = pcVar1 + lVar9;
    }
    std::locale::~locale(&local_70.m_Loc);
    std::locale::~locale(local_68);
    LVar4 = lsDEBUG;
    if ((pcVar7 == pcVar1 + sVar5 & (byte)lVar8) == 0) {
LAB_001bee3f:
      std::locale::locale(local_68);
      std::locale::locale(&local_70.m_Loc,local_68);
      pcVar1 = (local_60->_M_dataplus)._M_p;
      sVar5 = local_60->_M_string_length;
      if (sVar5 == 0) {
        bVar2 = false;
        pcVar7 = pcVar1;
      }
      else {
        uVar6 = 3;
        if (sVar5 - 1 < 3) {
          uVar6 = sVar5 - 1;
        }
        lVar8 = uVar6 + 1;
        lVar9 = 0;
        do {
          bVar2 = boost::algorithm::is_iequal::operator()(&local_70,pcVar1 + lVar9,"info" + lVar9);
          if (!bVar2) {
            bVar2 = false;
            goto LAB_001beece;
          }
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
        bVar2 = lVar9 == 4;
        pcVar7 = pcVar1 + lVar9;
      }
      bVar2 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar2);
LAB_001beece:
      std::locale::~locale(&local_70.m_Loc);
      bVar3 = true;
      if (!bVar2) {
        std::locale::locale(local_38);
        std::locale::locale(&local_70.m_Loc,local_38);
        pcVar1 = (local_60->_M_dataplus)._M_p;
        sVar5 = local_60->_M_string_length;
        if (sVar5 == 0) {
          bVar3 = false;
          pcVar7 = pcVar1;
        }
        else {
          uVar6 = 10;
          if (sVar5 - 1 < 10) {
            uVar6 = sVar5 - 1;
          }
          lVar8 = uVar6 + 1;
          lVar9 = 0;
          local_58 = sVar5;
          do {
            bVar3 = boost::algorithm::is_iequal::operator()
                              (&local_70,pcVar1 + lVar9,"information" + lVar9);
            if (!bVar3) {
              bVar3 = false;
              goto LAB_001bef7b;
            }
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
          bVar3 = lVar9 == 0xb;
          sVar5 = local_58;
          pcVar7 = pcVar1 + lVar9;
        }
        bVar3 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar3);
LAB_001bef7b:
        std::locale::~locale(&local_70.m_Loc);
      }
      if (!bVar2) {
        std::locale::~locale(local_38);
      }
      std::locale::~locale(local_68);
      LVar4 = lsINFO;
      if (!bVar3) {
        std::locale::locale(local_68);
        std::locale::locale(&local_70.m_Loc,local_68);
        pcVar1 = (local_60->_M_dataplus)._M_p;
        sVar5 = local_60->_M_string_length;
        if (sVar5 == 0) {
          bVar2 = false;
          pcVar7 = pcVar1;
        }
        else {
          uVar6 = 3;
          if (sVar5 - 1 < 3) {
            uVar6 = sVar5 - 1;
          }
          lVar8 = uVar6 + 1;
          lVar9 = 0;
          do {
            bVar2 = boost::algorithm::is_iequal::operator()(&local_70,pcVar1 + lVar9,"warn" + lVar9)
            ;
            if (!bVar2) {
              uVar6 = 0;
              goto LAB_001bf039;
            }
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
          bVar2 = lVar9 == 4;
          pcVar7 = pcVar1 + lVar9;
        }
        uVar6 = CONCAT71((int7)((ulong)lVar8 >> 8),pcVar7 == pcVar1 + sVar5 & bVar2);
LAB_001bf039:
        std::locale::~locale(&local_70.m_Loc);
        bVar2 = true;
        if ((char)uVar6 == '\0') {
          local_58 = CONCAT44(local_58._4_4_,(int)uVar6);
          std::locale::locale(local_40);
          std::locale::locale(&local_70.m_Loc,local_40);
          pcVar1 = (local_60->_M_dataplus)._M_p;
          sVar5 = local_60->_M_string_length;
          if (sVar5 == 0) {
            bVar2 = false;
            pcVar7 = pcVar1;
          }
          else {
            uVar6 = 6;
            if (sVar5 - 1 < 6) {
              uVar6 = sVar5 - 1;
            }
            lVar8 = 0;
            do {
              bVar2 = boost::algorithm::is_iequal::operator()
                                (&local_70,pcVar1 + lVar8,"warning" + lVar8);
              if (!bVar2) {
                std::locale::~locale(&local_70.m_Loc);
                goto LAB_001bf101;
              }
              lVar8 = lVar8 + 1;
            } while (uVar6 + 1 != lVar8);
            bVar2 = lVar8 == 7;
            pcVar7 = pcVar1 + lVar8;
          }
          std::locale::~locale(&local_70.m_Loc);
          if ((bool)(pcVar7 == pcVar1 + sVar5 & bVar2)) {
            bVar3 = false;
            uVar6 = local_58 & 0xffffffff;
            bVar2 = true;
          }
          else {
LAB_001bf101:
            std::locale::locale(local_48);
            std::locale::locale(&local_70.m_Loc,local_48);
            pcVar1 = (local_60->_M_dataplus)._M_p;
            sVar5 = local_60->_M_string_length;
            if (sVar5 == 0) {
              bVar2 = false;
              pcVar7 = pcVar1;
            }
            else {
              uVar6 = 7;
              if (sVar5 - 1 < 7) {
                uVar6 = sVar5 - 1;
              }
              lVar8 = 0;
              do {
                bVar2 = boost::algorithm::is_iequal::operator()
                                  (&local_70,pcVar1 + lVar8,"warnings" + lVar8);
                if (!bVar2) {
                  bVar2 = false;
                  goto LAB_001bf190;
                }
                lVar8 = lVar8 + 1;
              } while (uVar6 + 1 != lVar8);
              bVar2 = lVar8 == 8;
              pcVar7 = pcVar1 + lVar8;
            }
            bVar2 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar2);
LAB_001bf190:
            uVar6 = local_58 & 0xffffffff;
            std::locale::~locale(&local_70.m_Loc);
            bVar3 = true;
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3) {
          std::locale::~locale(local_48);
        }
        if ((char)uVar6 == '\0') {
          std::locale::~locale(local_40);
        }
        std::locale::~locale(local_68);
        LVar4 = lsWARNING;
        if (!bVar2) {
          std::locale::locale(local_68);
          std::locale::locale(&local_70.m_Loc,local_68);
          pcVar1 = (local_60->_M_dataplus)._M_p;
          sVar5 = local_60->_M_string_length;
          if (sVar5 == 0) {
            bVar2 = false;
            pcVar7 = pcVar1;
          }
          else {
            uVar6 = 4;
            if (sVar5 - 1 < 4) {
              uVar6 = sVar5 - 1;
            }
            lVar8 = 0;
            do {
              bVar2 = boost::algorithm::is_iequal::operator()
                                (&local_70,pcVar1 + lVar8,
                                 "field deserialization error" + lVar8 + 0x16);
              if (!bVar2) {
                bVar2 = false;
                goto LAB_001bf263;
              }
              lVar8 = lVar8 + 1;
            } while (uVar6 + 1 != lVar8);
            bVar2 = lVar8 == 5;
            pcVar7 = pcVar1 + lVar8;
          }
          bVar2 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar2);
LAB_001bf263:
          std::locale::~locale(&local_70.m_Loc);
          bVar3 = true;
          if (!bVar2) {
            std::locale::locale(local_50);
            std::locale::locale(&local_70.m_Loc,local_50);
            pcVar1 = (local_60->_M_dataplus)._M_p;
            sVar5 = local_60->_M_string_length;
            if (sVar5 == 0) {
              bVar3 = false;
              pcVar7 = pcVar1;
            }
            else {
              uVar6 = 5;
              if (sVar5 - 1 < 5) {
                uVar6 = sVar5 - 1;
              }
              lVar8 = 0;
              local_58 = sVar5;
              do {
                bVar3 = boost::algorithm::is_iequal::operator()
                                  (&local_70,pcVar1 + lVar8,"errors" + lVar8);
                if (!bVar3) {
                  bVar3 = false;
                  goto LAB_001bf310;
                }
                lVar8 = lVar8 + 1;
              } while (uVar6 + 1 != lVar8);
              bVar3 = lVar8 == 6;
              sVar5 = local_58;
              pcVar7 = pcVar1 + lVar8;
            }
            bVar3 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar3);
LAB_001bf310:
            std::locale::~locale(&local_70.m_Loc);
          }
          if (!bVar2) {
            std::locale::~locale(local_50);
          }
          std::locale::~locale(local_68);
          LVar4 = lsERROR;
          if (!bVar3) {
            std::locale::locale(local_68);
            std::locale::locale(&local_70.m_Loc,local_68);
            pcVar1 = (local_60->_M_dataplus)._M_p;
            sVar5 = local_60->_M_string_length;
            if (sVar5 == 0) {
              bVar2 = false;
              pcVar7 = pcVar1;
            }
            else {
              uVar6 = 4;
              if (sVar5 - 1 < 4) {
                uVar6 = sVar5 - 1;
              }
              lVar8 = 0;
              do {
                bVar2 = boost::algorithm::is_iequal::operator()
                                  (&local_70,pcVar1 + lVar8,"fatal" + lVar8);
                if (!bVar2) {
                  bVar2 = false;
                  goto LAB_001bf3d1;
                }
                lVar8 = lVar8 + 1;
              } while (uVar6 + 1 != lVar8);
              bVar2 = lVar8 == 5;
              pcVar7 = pcVar1 + lVar8;
            }
            bVar2 = (bool)(pcVar7 == pcVar1 + sVar5 & bVar2);
LAB_001bf3d1:
            std::locale::~locale(&local_70.m_Loc);
            bVar3 = true;
            if (!bVar2) {
              std::locale::locale(&local_70.m_Loc);
              bVar3 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                                (local_60,(char (*) [7])"fatals",&local_70.m_Loc);
              std::locale::~locale(&local_70.m_Loc);
            }
            std::locale::~locale(local_68);
            LVar4 = (uint)bVar3 + lsINVALID | lsFATAL;
          }
        }
      }
    }
  }
  return LVar4;
}

Assistant:

LogSeverity
Logs::fromString (std::string const& s)
{
    if (boost::iequals (s, "trace"))
        return lsTRACE;

    if (boost::iequals (s, "debug"))
        return lsDEBUG;

    if (boost::iequals (s, "info") || boost::iequals (s, "information"))
        return lsINFO;

    if (boost::iequals (s, "warn") || boost::iequals (s, "warning") || boost::iequals (s, "warnings"))
        return lsWARNING;

    if (boost::iequals (s, "error") || boost::iequals (s, "errors"))
        return lsERROR;

    if (boost::iequals (s, "fatal") || boost::iequals (s, "fatals"))
        return lsFATAL;

    return lsINVALID;
}